

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlogging.cpp
# Opt level: O1

QByteArray * qCleanupFuncinfo(QByteArray *__return_storage_ptr__,QByteArray info)

{
  byte bVar1;
  char cVar2;
  long lVar3;
  QArrayData *pQVar4;
  Data *pDVar5;
  bool bVar6;
  qsizetype qVar7;
  char *pcVar8;
  qsizetype qVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  __off_t in_RDX;
  undefined8 extraout_RDX;
  __off_t __length;
  QByteArray *in_RSI;
  char *pcVar14;
  char *pcVar15;
  char *pcVar16;
  long in_FS_OFFSET;
  QByteArrayView before;
  QByteArrayView after;
  QByteArrayView needle;
  QByteArrayView needle_00;
  QByteArrayView needle_01;
  QByteArrayView needle_02;
  QByteArrayView needle_03;
  QByteArrayView haystack;
  QByteArrayView haystack_00;
  QByteArrayView haystack_01;
  QByteArrayView haystack_02;
  QByteArrayView haystack_03;
  char *local_68;
  Data *local_60;
  QByteArray local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = (in_RSI->d).size;
  if (lVar3 == 0) {
    pDVar5 = (in_RSI->d).d;
    pcVar15 = (in_RSI->d).ptr;
    (in_RSI->d).d = (Data *)0x0;
    (in_RSI->d).ptr = (char *)0x0;
    (__return_storage_ptr__->d).d = pDVar5;
    (__return_storage_ptr__->d).ptr = pcVar15;
    qVar9 = 0;
  }
  else {
    if ((((in_RSI->d).ptr[lVar3 + -1] == ']') && (*(in_RSI->d).ptr != '+')) &&
       (*(in_RSI->d).ptr != '-')) {
      pcVar15 = (char *)(lVar3 + -1);
      do {
        if (pcVar15 == (char *)0x1) goto LAB_002112ae;
        pcVar16 = pcVar15 + -1;
        pcVar8 = (in_RSI->d).ptr + -1 + (long)pcVar15;
        pcVar15 = pcVar16;
      } while (*pcVar8 != '[');
      QByteArray::truncate(in_RSI,pcVar16,in_RDX);
LAB_002112ae:
      lVar3 = (in_RSI->d).size;
      if ((lVar3 != 0) && ((in_RSI->d).ptr[lVar3 + -1] == ' ')) {
        QByteArray::chop(in_RSI,1);
      }
    }
    before.m_data = "operator ";
    before.m_size = 9;
    after.m_data = "operator";
    after.m_size = 8;
    QByteArray::replace(in_RSI,before,after);
    local_60 = (__return_storage_ptr__->d).d;
    local_68 = (__return_storage_ptr__->d).ptr;
    qVar9 = (__return_storage_ptr__->d).size;
    pcVar15 = (char *)0xffffffffffffffff;
    do {
      pcVar15 = (char *)QByteArray::lastIndexOf(in_RSI,')',(qsizetype)pcVar15);
      if (pcVar15 == (char *)0xffffffffffffffff) {
        local_60 = (in_RSI->d).d;
        local_68 = (in_RSI->d).ptr;
        (in_RSI->d).d = (Data *)0x0;
        (in_RSI->d).ptr = (char *)0x0;
        qVar9 = (in_RSI->d).size;
        (in_RSI->d).size = 0;
        pcVar16 = (char *)0xffffffffffffffff;
LAB_00211394:
        iVar12 = 1;
        pcVar15 = pcVar16;
      }
      else {
        qVar7 = QByteArray::indexOf(in_RSI,'>',(qsizetype)pcVar15);
        if ((qVar7 == -1) &&
           (qVar7 = QByteArray::indexOf(in_RSI,':',(qsizetype)pcVar15), qVar7 == -1)) {
          pcVar16 = pcVar15 + -1;
          if (pcVar16 == (char *)0x0) {
            __length = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
          }
          else {
            uVar13 = 1;
            do {
              pcVar15 = pcVar16;
              cVar2 = (in_RSI->d).ptr[(long)pcVar15];
              iVar12 = -(uint)(cVar2 == '(');
              if (cVar2 == ')') {
                iVar12 = 1;
              }
              pcVar16 = pcVar15 + -1;
              uVar10 = iVar12 + (int)uVar13;
              __length = CONCAT71((int7)(uVar13 >> 8),uVar10 != 0);
            } while ((pcVar15 != (char *)0x1) && (uVar13 = (ulong)uVar10, uVar10 != 0));
          }
          if ((char)__length != '\0') {
            local_60 = (in_RSI->d).d;
            local_68 = (in_RSI->d).ptr;
            (in_RSI->d).d = (Data *)0x0;
            (in_RSI->d).ptr = (char *)0x0;
            qVar9 = (in_RSI->d).size;
            (in_RSI->d).size = 0;
            goto LAB_00211394;
          }
          QByteArray::truncate(in_RSI,pcVar15,__length);
          pcVar8 = (in_RSI->d).ptr;
          iVar12 = 4;
          if ((pcVar8[(long)pcVar16] == ')') &&
             (needle.m_data = "operator()", needle.m_size = 10, haystack.m_data = pcVar8,
             haystack.m_size = (in_RSI->d).size,
             pcVar16 = (char *)QtPrivate::findByteArray(haystack,0,needle), pcVar16 != pcVar15 + -10
             )) {
            QByteArray::indexOf(in_RSI,'(',0);
            QByteArray::remove(in_RSI,(char *)0x0);
            QByteArray::chop(in_RSI,1);
            goto LAB_0021135e;
          }
        }
        else {
          pcVar15 = pcVar15 + -1;
LAB_0021135e:
          iVar12 = 5;
        }
      }
    } while (iVar12 == 5);
    if (iVar12 != 4) {
      (__return_storage_ptr__->d).ptr = local_68;
      (__return_storage_ptr__->d).size = qVar9;
      (__return_storage_ptr__->d).d = local_60;
      goto LAB_002117e8;
    }
    (__return_storage_ptr__->d).ptr = local_68;
    (__return_storage_ptr__->d).size = qVar9;
    (__return_storage_ptr__->d).d = local_60;
    pcVar16 = pcVar15 + -1;
    if (0 < (long)pcVar15) {
      pcVar8 = (in_RSI->d).ptr;
      bVar1 = pcVar8[(long)pcVar16];
      if (bVar1 < 0x3d) {
        if (bVar1 == 0x29) {
          needle_01.m_data = "operator()";
          needle_01.m_size = 10;
          haystack_01.m_data = pcVar8;
          haystack_01.m_size = (in_RSI->d).size;
          pcVar14 = (char *)QtPrivate::findByteArray(haystack_01,0,needle_01);
          pcVar8 = pcVar15 + -10;
          pcVar15 = pcVar15 + -3;
        }
        else {
          if (bVar1 != 0x3c) goto LAB_002115d4;
          qVar9 = (in_RSI->d).size;
          pcVar14 = "operator<";
LAB_00211535:
          needle_00.m_data = pcVar14;
          needle_00.m_size = 9;
          haystack_00.m_data = pcVar8;
          haystack_00.m_size = qVar9;
          pcVar14 = (char *)QtPrivate::findByteArray(haystack_00,0,needle_00);
          pcVar8 = pcVar15 + -9;
          pcVar15 = pcVar15 + -2;
        }
        if (pcVar14 == pcVar8) {
          pcVar16 = pcVar15;
        }
      }
      else if (bVar1 == 0x3d) {
        qVar9 = (in_RSI->d).size;
        needle_02.m_data = "operator<=";
        needle_02.m_size = 10;
        haystack_02.m_data = pcVar8;
        haystack_02.m_size = qVar9;
        pcVar14 = (char *)QtPrivate::findByteArray(haystack_02,0,needle_02);
        if (pcVar14 == pcVar15 + -10) {
          pcVar16 = pcVar15 + -3;
        }
        else {
          needle_03.m_data = "operator>=";
          needle_03.m_size = 10;
          haystack_03.m_data = pcVar8;
          haystack_03.m_size = qVar9;
          pcVar8 = (char *)QtPrivate::findByteArray(haystack_03,0,needle_03);
          if (pcVar8 == pcVar15 + -10) {
            pcVar16 = pcVar15 + -3;
          }
        }
      }
      else if (bVar1 == 0x3e) {
        qVar9 = (in_RSI->d).size;
        pcVar14 = "operator>";
        goto LAB_00211535;
      }
    }
LAB_002115d4:
    iVar12 = 0;
    iVar11 = 0;
    while (-1 < (long)pcVar16) {
      if ((iVar11 < 0) || (iVar12 < 0)) goto LAB_002117c9;
      bVar1 = (in_RSI->d).ptr[(long)pcVar16];
      if (bVar1 < 0x3c) {
        if (bVar1 == 0x28) {
          iVar11 = iVar11 + -1;
          goto LAB_00211642;
        }
        if (bVar1 == 0x29) {
          iVar11 = iVar11 + 1;
          goto LAB_00211642;
        }
LAB_00211619:
        if ((iVar12 != 0 || bVar1 != 0x20) || iVar11 != 0) goto LAB_00211642;
        iVar11 = 0;
        bVar6 = false;
        iVar12 = 0;
      }
      else {
        if (bVar1 == 0x3c) {
          iVar12 = iVar12 + -1;
        }
        else {
          if (bVar1 != 0x3e) goto LAB_00211619;
          iVar12 = iVar12 + 1;
        }
LAB_00211642:
        pcVar16 = pcVar16 + -1;
        bVar6 = true;
      }
      if (!bVar6) break;
    }
    QByteArray::mid(&local_58,in_RSI,(qsizetype)(pcVar16 + 1),-1);
    pQVar4 = &((in_RSI->d).d)->super_QArrayData;
    pcVar15 = (in_RSI->d).ptr;
    (in_RSI->d).d = local_58.d.d;
    (in_RSI->d).ptr = local_58.d.ptr;
    qVar9 = (in_RSI->d).size;
    (in_RSI->d).size = local_58.d.size;
    local_58.d.d = (Data *)pQVar4;
    local_58.d.ptr = pcVar15;
    local_58.d.size = qVar9;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,1,0x10);
      }
    }
    while ((cVar2 = *(in_RSI->d).ptr, cVar2 == '&' || (cVar2 == '*'))) {
      QByteArray::mid(&local_58,in_RSI,1,-1);
      pQVar4 = &((in_RSI->d).d)->super_QArrayData;
      pcVar15 = (in_RSI->d).ptr;
      (in_RSI->d).d = local_58.d.d;
      (in_RSI->d).ptr = local_58.d.ptr;
      qVar9 = (in_RSI->d).size;
      (in_RSI->d).size = local_58.d.size;
      local_58.d.d = (Data *)pQVar4;
      local_58.d.ptr = pcVar15;
      local_58.d.size = qVar9;
      if (pQVar4 != (QArrayData *)0x0) {
        LOCK();
        (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar4,1,0x10);
        }
      }
    }
    pcVar15 = (char *)QByteArray::lastIndexOf(in_RSI,'>',-1);
    while ((pcVar15 != (char *)0xffffffffffffffff &&
           (qVar9 = QByteArray::indexOf(in_RSI,'<',0), qVar9 != -1))) {
      if (pcVar15 != (char *)0x1) {
        iVar12 = 1;
        pcVar16 = pcVar15;
        do {
          cVar2 = ((in_RSI->d).ptr + -1)[(long)pcVar16];
          if (cVar2 == '<') {
            iVar12 = iVar12 + -1;
          }
          else if (cVar2 == '>') {
            iVar12 = iVar12 + 1;
          }
          pcVar15 = pcVar16 + -1;
        } while ((pcVar16 != (char *)0x2) && (pcVar16 = pcVar15, iVar12 != 0));
      }
      QByteArray::remove(in_RSI,pcVar15);
      pcVar15 = (char *)QByteArray::lastIndexOf(in_RSI,'>',-1);
    }
LAB_002117c9:
    pDVar5 = (in_RSI->d).d;
    pcVar15 = (in_RSI->d).ptr;
    (in_RSI->d).d = (Data *)0x0;
    (in_RSI->d).ptr = (char *)0x0;
    (__return_storage_ptr__->d).d = pDVar5;
    (__return_storage_ptr__->d).ptr = pcVar15;
    qVar9 = (in_RSI->d).size;
  }
  (in_RSI->d).size = 0;
  (__return_storage_ptr__->d).size = qVar9;
LAB_002117e8:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

Q_AUTOTEST_EXPORT QByteArray qCleanupFuncinfo(QByteArray info)
{
    // Strip the function info down to the base function name
    // note that this throws away the template definitions,
    // the parameter types (overloads) and any const/volatile qualifiers.

    if (info.isEmpty())
        return info;

    qsizetype pos;

    // Skip trailing [with XXX] for templates (gcc), but make
    // sure to not affect Objective-C message names.
    pos = info.size() - 1;
    if (info.endsWith(']') && !(info.startsWith('+') || info.startsWith('-'))) {
        while (--pos) {
          if (info.at(pos) == '[') {
              info.truncate(pos);
              break;
          }
        }
        if (info.endsWith(' ')) {
          info.chop(1);
        }
    }

    // operator names with '(', ')', '<', '>' in it
    static const char operator_call[] = "operator()";
    static const char operator_lessThan[] = "operator<";
    static const char operator_greaterThan[] = "operator>";
    static const char operator_lessThanEqual[] = "operator<=";
    static const char operator_greaterThanEqual[] = "operator>=";

    // canonize operator names
    info.replace("operator ", "operator");

    pos = -1;
    // remove argument list
    forever {
        int parencount = 0;
        pos = info.lastIndexOf(')', pos);
        if (pos == -1) {
            // Don't know how to parse this function name
            return info;
        }
        if (info.indexOf('>', pos) != -1
                || info.indexOf(':', pos) != -1) {
            // that wasn't the function argument list.
            --pos;
            continue;
        }

        // find the beginning of the argument list
        --pos;
        ++parencount;
        while (pos && parencount) {
            if (info.at(pos) == ')')
                ++parencount;
            else if (info.at(pos) == '(')
                --parencount;
            --pos;
        }
        if (parencount != 0)
            return info;

        info.truncate(++pos);

        if (info.at(pos - 1) == ')') {
            if (info.indexOf(operator_call) == pos - qsizetype(strlen(operator_call)))
                break;

            // this function returns a pointer to a function
            // and we matched the arguments of the return type's parameter list
            // try again
            info.remove(0, info.indexOf('('));
            info.chop(1);
            continue;
        } else {
            break;
        }
    }